

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

Wln_Ntk_t * Wln_NtkDupDfs(Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  char *__s;
  int iVar3;
  int i;
  Wln_Ntk_t *pNew;
  size_t sVar4;
  char *__dest;
  int *piVar5;
  Wln_Vec_t *pWVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  pNew = Wln_NtkAlloc(p->pName,(p->vTypes).nSize);
  pNew->fSmtLib = p->fSmtLib;
  __s = p->pSpec;
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
    pNew->pSpec = __dest;
  }
  uVar1 = (p->vTypes).nCap;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  if (0 < (p->vCis).nSize) {
    lVar9 = 0;
    do {
      Wln_ObjDup(pNew,p,(p->vCis).pArray[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCis).nSize);
  }
  if (0 < (p->vFfs).nSize) {
    lVar9 = 0;
    do {
      iVar2 = (p->vFfs).pArray[lVar9];
      iVar3 = Wln_ObjClone(pNew,p,iVar2);
      if (((long)iVar2 < 0) || ((p->vCopies).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar2] = iVar3;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vFfs).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar9 = 0;
    do {
      Wln_NtkDupDfs_rec(pNew,p,(p->vCos).pArray[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCos).nSize);
  }
  if (0 < (p->vFfs).nSize) {
    lVar9 = 0;
    do {
      pWVar6 = p->vFanins;
      iVar2 = (p->vFfs).pArray[lVar9];
      lVar8 = (long)iVar2;
      uVar7 = (ulong)(uint)pWVar6[lVar8].nSize;
      if (0 < pWVar6[lVar8].nSize) {
        lVar11 = lVar8 * 0x10 + 8;
        lVar10 = 0;
        do {
          if ((int)uVar7 < 3) {
            piVar5 = (int *)((long)&pWVar6->nCap + lVar11);
          }
          else {
            piVar5 = pWVar6[lVar8].field_2.pArray[0] + lVar10;
          }
          if (*piVar5 != 0) {
            if ((iVar2 < 0) || ((p->vCopies).nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = (p->vCopies).pArray[lVar8];
            i = Wln_NtkDupDfs_rec(pNew,p,*piVar5);
            Wln_ObjAddFanin(pNew,iVar3,i);
          }
          lVar10 = lVar10 + 1;
          pWVar6 = p->vFanins;
          uVar7 = (ulong)pWVar6[lVar8].nSize;
          lVar11 = lVar11 + 4;
        } while (lVar10 < (long)uVar7);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vFfs).nSize);
  }
  if (0 < (p->vNameIds).nSize) {
    Wln_NtkTransferNames(pNew,p);
  }
  return pNew;
}

Assistant:

Wln_Ntk_t * Wln_NtkDupDfs( Wln_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Wln_Ntk_t * pNew = Wln_NtkAlloc( p->pName, Wln_NtkObjNum(p) );
    pNew->fSmtLib = p->fSmtLib;
    if ( p->pSpec ) pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Wln_NtkCleanCopy( p );
    Wln_NtkForEachCi( p, iObj, i )
        Wln_ObjDup( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjSetCopy( p, iObj, Wln_ObjClone(pNew, p, iObj) );
    Wln_NtkForEachCo( p, iObj, i )
        Wln_NtkDupDfs_rec( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjAddFanin( pNew, Wln_ObjCopy(p, iObj), Wln_NtkDupDfs_rec(pNew, p, iFanin) );
    if ( Wln_NtkHasNameId(p) )
        Wln_NtkTransferNames( pNew, p );
    return pNew;
}